

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# disp.hpp
# Opt level: O3

void __thiscall
so_5::disp::adv_thread_pool::impl::agent_queue_t::push
          (agent_queue_t *this,execution_demand_t *demand)

{
  __atomic_flag_data_type _Var1;
  message_t *pmVar2;
  demand_handler_pfn_t p_Var3;
  control_block_t *pcVar4;
  mbox_id_t mVar5;
  type_info *ptVar6;
  demand_t *pdVar7;
  
  pdVar7 = (demand_t *)operator_new(0x38);
  pcVar4 = demand->m_limit;
  mVar5 = demand->m_mbox_id;
  ptVar6 = (demand->m_msg_type)._M_target;
  (pdVar7->m_demand).m_receiver = demand->m_receiver;
  (pdVar7->m_demand).m_limit = pcVar4;
  (pdVar7->m_demand).m_mbox_id = mVar5;
  (pdVar7->m_demand).m_msg_type._M_target = ptVar6;
  pmVar2 = (demand->m_message_ref).m_obj;
  p_Var3 = demand->m_demand_handler;
  (demand->m_message_ref).m_obj = (message_t *)0x0;
  (pdVar7->m_demand).m_message_ref.m_obj = pmVar2;
  (pdVar7->m_demand).m_demand_handler = p_Var3;
  pdVar7->m_next = (demand_t *)0x0;
  while( true ) {
    LOCK();
    _Var1 = (this->m_lock).m_flag.super___atomic_flag_base._M_i;
    (this->m_lock).m_flag.super___atomic_flag_base._M_i = true;
    UNLOCK();
    if (_Var1 == false) break;
    sched_yield();
  }
  this->m_tail->m_next = pdVar7;
  this->m_tail = pdVar7;
  LOCK();
  (this->m_size).super___atomic_base<unsigned_long>._M_i =
       (this->m_size).super___atomic_base<unsigned_long>._M_i + 1;
  UNLOCK();
  if ((((this->m_head).m_next == this->m_tail) && (this->m_active == false)) &&
     ((this->m_workers & 1) == 0)) {
    this->m_active = true;
    (this->m_lock).m_flag.super___atomic_flag_base._M_i = false;
    reuse::mpmc_ptr_queue_t<so_5::disp::adv_thread_pool::impl::agent_queue_t>::schedule
              (this->m_disp_queue,this);
    return;
  }
  (this->m_lock).m_flag.super___atomic_flag_base._M_i = false;
  return;
}

Assistant:

virtual void
		push( execution_demand_t demand )
			{
				bool need_schedule = false;
				{
					// Do memory allocation before spinlock locking.
					auto new_demand = new demand_t( std::move( demand ) );

					std::lock_guard< spinlock_t > lock( m_lock );

					m_tail->m_next = new_demand;
					m_tail = m_tail->m_next;

					++m_size;

					if( m_head.m_next == m_tail )
						{
							// Queue was empty. Need to detect
							// necessity of queue activation.
							if( !m_active )
								if( !is_there_not_thread_safe_worker() )
								{
									need_schedule = true;
									m_active = true;
								}
						}

					SO_5_CHECK_INVARIANT( !empty(), this )
					SO_5_CHECK_INVARIANT( m_active || is_there_any_worker(), this )
					SO_5_CHECK_INVARIANT( !(need_schedule && !m_active), this )
				}

				if( need_schedule )
					m_disp_queue.schedule( this );
			}